

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fc_layer.h
# Opt level: O3

void __thiscall fc_layer_t::calc_grads(fc_layer_t *this,tensor_t<float> *grad_next_layer)

{
  float fVar1;
  pointer __s;
  pointer pfVar2;
  pointer pgVar3;
  float *pfVar4;
  int iVar5;
  long lVar6;
  int _y;
  int _x;
  int iVar7;
  undefined1 auVar8 [16];
  float fVar9;
  
  __s = (this->super_layer_t).grads_in.data.super__Vector_base<float,_std::allocator<float>_>.
        _M_impl.super__Vector_impl_data._M_start;
  pfVar2 = (this->super_layer_t).grads_in.data.super__Vector_base<float,_std::allocator<float>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (__s != pfVar2) {
    memset(__s,0,(long)pfVar2 - (long)__s & 0xfffffffffffffffc);
  }
  if (0 < (this->super_layer_t).out.size.x) {
    lVar6 = 0;
    do {
      pgVar3 = (this->gradients).super__Vector_base<gradient_t,_std::allocator<gradient_t>_>._M_impl
               .super__Vector_impl_data._M_start;
      pfVar4 = tensor_t<float>::get(grad_next_layer,(int)lVar6,0,0);
      auVar8._8_4_ = 0x80000000;
      auVar8._0_8_ = 0x8000000080000000;
      auVar8._12_4_ = 0x80000000;
      auVar8 = vxorps_avx512vl(ZEXT416((uint)(this->input).
                                             super__Vector_base<float,_std::allocator<float>_>.
                                             _M_impl.super__Vector_impl_data._M_start[lVar6]),auVar8
                              );
      fVar9 = expf(auVar8._0_4_);
      fVar9 = 1.0 / (fVar9 + 1.0);
      auVar8 = ZEXT416((uint)(fVar9 * *pfVar4));
      auVar8 = vfnmadd213ss_fma(auVar8,ZEXT416((uint)fVar9),auVar8);
      pgVar3[lVar6].grad = auVar8._0_4_;
      iVar5 = (this->super_layer_t).in.size.x;
      if (0 < iVar5) {
        iVar7 = (this->super_layer_t).in.size.y;
        _x = 0;
        do {
          if (0 < iVar7) {
            iVar5 = (this->super_layer_t).in.size.z;
            _y = 0;
            do {
              if (0 < iVar5) {
                iVar7 = 0;
                do {
                  fVar9 = pgVar3[lVar6].grad;
                  pfVar4 = tensor_t<float>::get
                                     (&this->weights,
                                      ((this->super_layer_t).in.size.y * iVar7 + _y) *
                                      (this->super_layer_t).in.size.x + _x,(int)lVar6,0);
                  fVar1 = *pfVar4;
                  pfVar4 = tensor_t<float>::get(&(this->super_layer_t).grads_in,_x,_y,iVar7);
                  auVar8 = vfmadd213ss_fma(ZEXT416((uint)fVar1),ZEXT416((uint)fVar9),
                                           ZEXT416((uint)*pfVar4));
                  *pfVar4 = auVar8._0_4_;
                  iVar7 = iVar7 + 1;
                  iVar5 = (this->super_layer_t).in.size.z;
                } while (iVar7 < iVar5);
                iVar7 = (this->super_layer_t).in.size.y;
              }
              _y = _y + 1;
            } while (_y < iVar7);
            iVar5 = (this->super_layer_t).in.size.x;
          }
          _x = _x + 1;
        } while (_x < iVar5);
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < (this->super_layer_t).out.size.x);
  }
  return;
}

Assistant:

void calc_grads(tensor_t<float> &grad_next_layer) {
    grads_in.clear();
    for (int n = 0; n < out.size.x; n++) {
      gradient_t &grad = gradients[n];
      grad.grad = grad_next_layer(n, 0, 0) * activator_derivative(input[n]);

      for (int i = 0; i < in.size.x; i++)
        for (int j = 0; j < in.size.y; j++)
          for (int z = 0; z < in.size.z; z++) {
            int m = map({i, j, z});
            grads_in(i, j, z) += grad.grad * weights(m, n, 0);
          }
    }
  }